

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphInternal.h
# Opt level: O1

ExpandMacroResult __thiscall
cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::PackagePreset>::operator()
          (PresetMacroExpander<cmCMakePresetsGraph::PackagePreset> *this,string *macroNamespace,
          string *macroName,string *macroOut,int version)

{
  int iVar1;
  string local_48;
  
  if (macroNamespace->_M_string_length != 0) {
    return Ignore;
  }
  iVar1 = std::__cxx11::string::compare((char *)macroName);
  if (iVar1 == 0) {
    std::__cxx11::string::_M_append
              ((char *)macroOut,(ulong)(this->Preset->super_Preset).Name._M_dataplus._M_p);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)macroName);
    if (iVar1 == 0) {
      if ((this->Preset->super_Preset).Hidden != false) {
        return Ok;
      }
      cmCMakePresetsGraph::GetGeneratorForPreset
                (&local_48,this->Graph,&(this->Preset->super_Preset).Name);
      std::__cxx11::string::_M_append((char *)macroOut,(ulong)local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return Ok;
      }
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      return Ok;
    }
    iVar1 = std::__cxx11::string::compare((char *)macroName);
    if (iVar1 != 0) {
      return Ignore;
    }
    if (version < 4) {
      return Error;
    }
    cmsys::SystemTools::GetParentDirectory
              (&local_48,&((this->Preset->super_Preset).OriginFile)->Filename);
    std::__cxx11::string::_M_append((char *)macroOut,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return Ok;
}

Assistant:

ExpandMacroResult operator()(const std::string& macroNamespace,
                               const std::string& macroName,
                               std::string& macroOut,
                               int version) const override
  {
    if (macroNamespace.empty()) {
      if (macroName == "presetName") {
        macroOut += Preset.Name;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "generator") {
        // Generator only makes sense if preset is not hidden.
        if (!Preset.Hidden) {
          macroOut += Graph.GetGeneratorForPreset(Preset.Name);
        }
        return ExpandMacroResult::Ok;
      }
      if (macroName == "fileDir") {
        if (version < 4) {
          return ExpandMacroResult::Error;
        }
        macroOut +=
          cmSystemTools::GetParentDirectory(Preset.OriginFile->Filename);
        return ExpandMacroResult::Ok;
      }
    }
    return ExpandMacroResult::Ignore;
  }